

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

void __thiscall Context<true>::Context(Context<true> *this)

{
  LabelObjectState<true> *in_RDI;
  
  std::unique_ptr<std::__cxx11::stringstream,std::default_delete<std::__cxx11::stringstream>>::
  unique_ptr<std::default_delete<std::__cxx11::stringstream>,void>
            ((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_RDI);
  std::vector<Namespace<true>,_std::allocator<Namespace<true>_>_>::vector
            ((vector<Namespace<true>,_std::allocator<Namespace<true>_>_> *)0x2a6233);
  DefaultState<true>::DefaultState((DefaultState<true> *)in_RDI);
  LabelState<true>::LabelState((LabelState<true> *)in_RDI);
  LabelObjectState<true>::LabelObjectState(in_RDI);
  LabelSinglePropertyState<true>::LabelSinglePropertyState((LabelSinglePropertyState<true> *)in_RDI)
  ;
  LabelIndexState<true>::LabelIndexState((LabelIndexState<true> *)in_RDI);
  TextState<true>::TextState((TextState<true> *)in_RDI);
  TagState<true>::TagState((TagState<true> *)in_RDI);
  MultiState<true>::MultiState((MultiState<true> *)in_RDI);
  IgnoreState<true>::IgnoreState((IgnoreState<true> *)in_RDI);
  ArrayState<true>::ArrayState((ArrayState<true> *)in_RDI);
  DecisionServiceState<true>::DecisionServiceState((DecisionServiceState<true> *)in_RDI);
  ArrayToVectorState<true,_float>::ArrayToVectorState((ArrayToVectorState<true,_float> *)in_RDI);
  ArrayToVectorState<true,_unsigned_int>::ArrayToVectorState
            ((ArrayToVectorState<true,_unsigned_int> *)in_RDI);
  StringToStringState<true>::StringToStringState((StringToStringState<true> *)in_RDI);
  FloatToFloatState<true>::FloatToFloatState((FloatToFloatState<true> *)in_RDI);
  BoolToBoolState<true>::BoolToBoolState((BoolToBoolState<true> *)in_RDI);
  *(cb_class **)&(in_RDI->cb_label).probability = &in_RDI[2].cb_label;
  *(cb_class **)&in_RDI[9].found = &in_RDI[2].cb_label;
  return;
}

Assistant:

Context()
  {
    current_state = &default_state;
    root_state = &default_state;
  }